

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::TimeZoneNamesImpl::getTimeZoneDisplayName
          (TimeZoneNamesImpl *this,UnicodeString *tzID,UTimeZoneNameType type,UnicodeString *name)

{
  TimeZoneNamesImpl *pTVar1;
  UBool UVar2;
  ZNames *this_00;
  ConstChar16Ptr local_70;
  UChar *local_68;
  UChar *s;
  UErrorCode local_4c;
  UErrorCode status;
  Mutex lock;
  TimeZoneNamesImpl *nonConstThis;
  ZNames *tznames;
  UnicodeString *name_local;
  UTimeZoneNameType type_local;
  UnicodeString *tzID_local;
  TimeZoneNamesImpl *this_local;
  
  UnicodeString::setToBogus(name);
  UVar2 = UnicodeString::isEmpty(tzID);
  pTVar1 = (TimeZoneNamesImpl *)name;
  if (UVar2 == '\0') {
    lock.fMutex = (UMutex *)this;
    Mutex::Mutex((Mutex *)&stack0xffffffffffffffb8,(UMutex *)gDataMutex);
    local_4c = U_ZERO_ERROR;
    this_00 = loadTimeZoneNames((TimeZoneNamesImpl *)lock.fMutex,tzID,&local_4c);
    UVar2 = ::U_FAILURE(local_4c);
    if (UVar2 != '\0') {
      this_local = (TimeZoneNamesImpl *)name;
    }
    s._0_4_ = (uint)(UVar2 != '\0');
    Mutex::~Mutex((Mutex *)&stack0xffffffffffffffb8);
    pTVar1 = this_local;
    if ((((uint)s == 0) && (pTVar1 = (TimeZoneNamesImpl *)name, this_00 != (ZNames *)0x0)) &&
       (local_68 = ZNames::getName(this_00,type), pTVar1 = (TimeZoneNamesImpl *)name,
       local_68 != (UChar *)0x0)) {
      ConstChar16Ptr::ConstChar16Ptr(&local_70,local_68);
      UnicodeString::setTo(name,'\x01',&local_70,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_70);
      pTVar1 = (TimeZoneNamesImpl *)name;
    }
  }
  this_local = pTVar1;
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString&
TimeZoneNamesImpl::getTimeZoneDisplayName(const UnicodeString& tzID, UTimeZoneNameType type, UnicodeString& name) const {
    name.setToBogus();  // cleanup result.
    if (tzID.isEmpty()) {
        return name;
    }

    ZNames *tznames = NULL;
    TimeZoneNamesImpl *nonConstThis = const_cast<TimeZoneNamesImpl *>(this);

    {
        Mutex lock(&gDataMutex);
        UErrorCode status = U_ZERO_ERROR;
        tznames = nonConstThis->loadTimeZoneNames(tzID, status);
        if (U_FAILURE(status)) { return name; }
    }

    if (tznames != NULL) {
        const UChar *s = tznames->getName(type);
        if (s != NULL) {
            name.setTo(TRUE, s, -1);
        }
    }
    return name;
}